

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffpdes(fitsfile *fptr,int colnum,LONGLONG rownum,LONGLONG length,LONGLONG heapaddr,int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  int iVar3;
  long lVar4;
  uint descript4 [2];
  long local_48;
  LONGLONG local_40;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_0013ba24;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  ptVar2 = pFVar1->tableptr;
  lVar4 = (long)colnum;
  if (-1 < ptVar2[lVar4 + -1].tdatatype) {
    *status = 0x13d;
  }
  ffmbyt(fptr,(rownum + -1) * pFVar1->rowlength + pFVar1->datastart + ptVar2[lVar4 + -1].tbcol,1,
         status);
  if ((ptVar2[lVar4 + -1].tform[0] == 'P') || (ptVar2[lVar4 + -1].tform[1] == 'P')) {
    if ((ulong)(heapaddr | length) >> 0x20 != 0) {
      ffxmsg(5,"P variable length column descriptor is out of range");
      *status = 0x19c;
      return 0x19c;
    }
    local_48 = CONCAT44((int)heapaddr,(int)length);
    ffpi4b(fptr,2,4,(int *)&local_48,status);
  }
  else {
    local_48 = length;
    local_40 = heapaddr;
    ffpi8b(fptr,2,8,&local_48,status);
  }
LAB_0013ba24:
  return *status;
}

Assistant:

int ffpdes(fitsfile *fptr,  /* I - FITS file pointer                         */
           int colnum,      /* I - column number (1 = 1st column of table)   */
           LONGLONG rownum,     /* I - row number (1 = 1st row of table)         */
           LONGLONG length,    /* I - number of elements in the row             */
           LONGLONG heapaddr,  /* I - heap pointer to the data                  */
           int *status)     /* IO - error status                             */
/*
  put (write) the variable length vector descriptor to the table.
*/
{
    LONGLONG bytepos;
    unsigned int descript4[2];
    LONGLONG descript8[2];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);   /* offset to the correct column */

    if (colptr->tdatatype >= 0)
        *status = NOT_VARI_LEN;

    bytepos = (fptr->Fptr)->datastart + 
                  ((fptr->Fptr)->rowlength * (rownum - 1)) +
                  colptr->tbcol;

    ffmbyt(fptr, bytepos, IGNORE_EOF, status); /* move to element */

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        if (length   > UINT_MAX || length   < 0 ||
            heapaddr > UINT_MAX || heapaddr < 0) {
            ffpmsg("P variable length column descriptor is out of range");
	    *status = NUM_OVERFLOW;
            return(*status);
        }
           
        descript4[0] = (unsigned int) length;   /* 1st word is the length  */
        descript4[1] = (unsigned int) heapaddr; /* 2nd word is the address */
 
        ffpi4b(fptr, 2, 4, (INT32BIT *) descript4, status); /* write the descriptor */
    }
    else /* this is a 'Q' descriptor column */
    {
        descript8[0] =  length;   /* 1st word is the length  */
        descript8[1] =  heapaddr; /* 2nd word is the address */
 
        ffpi8b(fptr, 2, 8, (long *) descript8, status); /* write the descriptor */
    }

    return(*status);
}